

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O1

bool __thiscall hwnet::TCPSocket::IsClosed(TCPSocket *this)

{
  __int_type_conflict1 _Var1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar2 == 0) {
    _Var1 = (this->closed)._M_base._M_i;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return (bool)(_Var1 & 1);
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool IsClosed() {
		std::lock_guard<std::mutex> guard(this->mtx);
		return this->closed;
	}